

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::anon_unknown_26::TapAssertionPrinter::printMessage(TapAssertionPrinter *this)

{
  MessageInfo *pMVar1;
  ostream *poVar2;
  undefined8 uStack_18;
  
  uStack_18 = this->messages;
  if ((this->itMessage)._M_current !=
      (uStack_18->super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    poVar2 = this->stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," \'",2);
    pMVar1 = (this->itMessage)._M_current;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(pMVar1->message)._M_dataplus._M_p,(pMVar1->message)._M_string_length
                       );
    uStack_18 = (vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                CONCAT17(0x27,(undefined7)uStack_18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_18 + 7),1);
    (this->itMessage)._M_current = (this->itMessage)._M_current + 1;
  }
  return;
}

Assistant:

void printMessage() {
                if (itMessage != messages.end()) {
                    stream << " '" << itMessage->message << '\'';
                    ++itMessage;
                }
            }